

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationSection.cxx
# Opt level: O2

void __thiscall cmDocumentationSection::Append(cmDocumentationSection *this,char *n,char *b)

{
  cmDocumentationEntry local_50;
  
  cmDocumentationEntry::cmDocumentationEntry(&local_50,n,b);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
  emplace_back<cmDocumentationEntry>(&this->Entries,&local_50);
  cmDocumentationEntry::~cmDocumentationEntry(&local_50);
  return;
}

Assistant:

void cmDocumentationSection::Append(const char* n, const char* b)
{
  this->Entries.push_back(cmDocumentationEntry(n, b));
}